

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fio.c
# Opt level: O0

void block_init(block_s *blk)

{
  uint16_t *puVar1;
  block_s *blk_local;
  
  blk->ref = 1;
  blk->pos = 2;
  blk[1].ref = 0;
  blk[1].pos = 0;
  blk[1].max = 0;
  blk[1].root_ref = 0;
  blk[1].parent = (block_s *)0x0;
  LOCK();
  puVar1 = &blk->parent->root_ref;
  *puVar1 = *puVar1 + 1;
  UNLOCK();
  return;
}

Assistant:

static inline void block_init(block_s *blk) {
  /* initialization shouldn't effect `parent` or `root_ref`*/
  blk->ref = 1;
  blk->pos = FIO_MEMORY_BLOCK_START_POS;
  /* zero out linked list memory (everything else is already zero) */
  ((block_node_s *)blk)->node.next = NULL;
  ((block_node_s *)blk)->node.prev = NULL;
  /* bump parent reference count */
  fio_atomic_add(&blk->parent->root_ref, 1);
}